

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_153ab3::Db::parsePositiveInteger(Db *this,size_t *Out)

{
  bool bVar1;
  char cVar2;
  size_t *Out_local;
  Db *this_local;
  
  *Out = 0;
  cVar2 = look(this,0);
  if ((cVar2 < '0') || (cVar2 = look(this,0), '9' < cVar2)) {
    this_local._7_1_ = true;
  }
  else {
    while( true ) {
      cVar2 = look(this,0);
      bVar1 = false;
      if ('/' < cVar2) {
        cVar2 = look(this,0);
        bVar1 = cVar2 < ':';
      }
      if (!bVar1) break;
      *Out = *Out * 10;
      cVar2 = consume(this);
      *Out = (long)(cVar2 + -0x30) + *Out;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Db::parsePositiveInteger(size_t *Out) {
  *Out = 0;
  if (look() < '0' || look() > '9')
    return true;
  while (look() >= '0' && look() <= '9') {
    *Out *= 10;
    *Out += static_cast<size_t>(consume() - '0');
  }
  return false;
}